

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O2

string * __thiscall
iDynTree::Triplets::description_abi_cxx11_(string *__return_storage_ptr__,Triplets *this)

{
  ostream *poVar1;
  pointer pTVar2;
  ostringstream str;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (pTVar2 = (this->m_triplets).
                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 != (this->m_triplets).
                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    poVar1 = std::operator<<((ostream *)local_1a8,"(");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
    poVar1 = std::ostream::_M_insert<double>(pTVar2->value);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Triplets::description() const
    {
        std::ostringstream str;
        for (const_iterator triplet(begin()); triplet != end(); ++triplet) {
            str << "(" << triplet->row << "," << triplet->column << ")" << triplet->value << std::endl;
        }
        return str.str();
    }